

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::RemoveTest(cmCTestMultiProcessHandler *this,int index)

{
  mapped_type *pmVar1;
  int local_14;
  cmCTestMultiProcessHandler *pcStack_10;
  int index_local;
  cmCTestMultiProcessHandler *this_local;
  
  local_14 = index;
  pcStack_10 = this;
  EraseTest(this,index);
  std::
  map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  ::erase(&(this->Properties).
           super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
          ,&local_14);
  pmVar1 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->TestRunningMap,&local_14);
  *pmVar1 = false;
  pmVar1 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->TestFinishMap,&local_14);
  *pmVar1 = true;
  this->Completed = this->Completed + 1;
  return;
}

Assistant:

void cmCTestMultiProcessHandler::RemoveTest(int index)
{
  this->EraseTest(index);
  this->Properties.erase(index);
  this->TestRunningMap[index] = false;
  this->TestFinishMap[index] = true;
  this->Completed++;
}